

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_logger::tracker_request_error
          (tracker_logger *this,tracker_request *param_1,error_code *ec,operation_t op,string *str,
          seconds32 retry_interval)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_58;
  string *local_38;
  string *str_local;
  error_code *peStack_28;
  operation_t op_local;
  error_code *ec_local;
  tracker_request *param_1_local;
  tracker_logger *this_local;
  seconds32 retry_interval_local;
  
  local_38 = str;
  str_local._7_1_ = op;
  peStack_28 = ec;
  ec_local = (error_code *)param_1;
  param_1_local = (tracker_request *)this;
  this_local._4_4_ = retry_interval.__r;
  pcVar1 = operation_name(op);
  boost::system::error_code::message_abi_cxx11_(&local_58,peStack_28);
  uVar2 = ::std::__cxx11::string::c_str();
  uVar3 = ::std::__cxx11::string::c_str();
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"*** tracker error: [%s] %s %s",pcVar1,uVar2,uVar3);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void tracker_logger::tracker_request_error(tracker_request const&
			, error_code const& ec, operation_t const op, std::string const& str
			, seconds32 const retry_interval)
		{
			TORRENT_UNUSED(retry_interval);
			debug_log("*** tracker error: [%s] %s %s"
				, operation_name(op), ec.message().c_str(), str.c_str());
		}